

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::js::Generator::GenerateAll
          (Generator *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,string *parameter,GeneratorContext *context,string *error)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined4 extraout_var;
  LogMessage *pLVar6;
  undefined4 extraout_var_00;
  ulong uVar7;
  pointer ppFVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Base_ptr p_Var9;
  undefined4 extraout_var_03;
  FileDescriptor *pFVar10;
  _Base_ptr *pp_Var11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  string *desc;
  _Base_ptr p_Var13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  Printer *printer_00;
  Printer *printer_01;
  Printer *extraout_RDX;
  Printer *extraout_RDX_00;
  Printer *extraout_RDX_01;
  Printer *printer_02;
  long lVar15;
  GeneratorOptions *pGVar16;
  undefined8 uVar17;
  _Base_ptr p_Var18;
  Generator *pGVar19;
  Printer *pPVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  GeneratorOptions *pGVar25;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  provided;
  string filename_1;
  set<const_void_*,_std::less<const_void_*>,_std::allocator<const_void_*>_> allowed_set;
  Printer printer;
  string filename_4;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  GeneratorOptions options;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  option_pairs;
  undefined1 local_2c8 [12];
  uint uStack_2bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  _Base_ptr local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  undefined1 local_290 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Base_ptr local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  string local_228;
  undefined1 local_208 [8];
  FieldDescriptor **ppFStack_200;
  _Base_ptr local_1f8;
  _Base_ptr local_1f0;
  _Base_ptr local_1e8;
  size_t local_1e0;
  undefined1 local_1d8 [8];
  undefined1 local_1d0 [8];
  _Base_ptr local_1c8;
  _Base_ptr p_Stack_1c0;
  _Base_ptr local_1b8;
  _Alloc_hider local_1b0;
  size_type local_1a8;
  undefined1 local_1a0 [24];
  _Base_ptr local_188;
  _Base_ptr local_180;
  _Base_ptr local_178;
  undefined1 local_150 [56];
  undefined1 local_118 [32];
  undefined1 local_f8 [96];
  _Rb_tree_node_base local_98;
  long local_70 [2];
  char local_60;
  ulong local_58;
  FieldDescriptor *local_50;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  ZeroCopyOutputStream *pZVar5;
  
  local_48.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseGeneratorParameter(parameter,&local_48);
  GeneratorOptions::GeneratorOptions((GeneratorOptions *)(local_118 + 0x20));
  bVar2 = GeneratorOptions::ParseFromOptions((GeneratorOptions *)(local_118 + 0x20),&local_48,error)
  ;
  if (bVar2) {
    if (local_f8._68_4_ == 0) {
      if ((local_60 == '\0') && (local_f8._88_8_ != 0)) {
        local_290._0_8_ = &local_280;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_290,local_f8._0_8_,(pointer)(local_f8._8_8_ + local_f8._0_8_));
        std::__cxx11::string::append(local_290);
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append(local_290,local_f8._80_8_);
        pp_Var11 = (_Base_ptr *)(puVar4 + 2);
        if ((_Base_ptr *)*puVar4 == pp_Var11) {
          local_1c8 = *pp_Var11;
          p_Stack_1c0 = (_Base_ptr)puVar4[3];
          local_1d8 = (undefined1  [8])&local_1c8;
        }
        else {
          local_1c8 = *pp_Var11;
          local_1d8 = (undefined1  [8])*puVar4;
        }
        local_1d0 = (undefined1  [8])puVar4[1];
        *puVar4 = pp_Var11;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        GeneratorOptions::GetFileNameExtension_abi_cxx11_
                  ((string *)local_2c8,(GeneratorOptions *)(local_118 + 0x20));
        p_Var13 = (_Base_ptr)0xf;
        if (local_1d8 != (undefined1  [8])&local_1c8) {
          p_Var13 = local_1c8;
        }
        if (p_Var13 < (_Base_ptr)(stack0xfffffffffffffd40->_M_local_buf + (long)local_1d0)) {
          uVar17 = (_Base_ptr)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._0_8_ != &local_2b8) {
            uVar17 = local_2b8._M_allocated_capacity;
          }
          if ((ulong)uVar17 < (_Base_ptr)(stack0xfffffffffffffd40->_M_local_buf + (long)local_1d0))
          goto LAB_0022a342;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)local_2c8,0,(char *)0x0,(ulong)local_1d8);
        }
        else {
LAB_0022a342:
          puVar4 = (undefined8 *)std::__cxx11::string::_M_append(local_1d8,local_2c8._0_8_);
        }
        local_150._0_8_ = local_150 + 0x10;
        pcVar1 = (pointer)(puVar4 + 2);
        if ((pointer)*puVar4 == pcVar1) {
          local_150._16_8_ = *(undefined8 *)pcVar1;
          local_150._24_8_ = puVar4[3];
        }
        else {
          local_150._16_8_ = *(undefined8 *)pcVar1;
          local_150._0_8_ = (pointer)*puVar4;
        }
        local_150._8_8_ = puVar4[1];
        *puVar4 = pcVar1;
        puVar4[1] = 0;
        *pcVar1 = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._0_8_ != &local_2b8) {
          operator_delete((void *)local_2c8._0_8_,(ulong)(local_2b8._M_allocated_capacity + 1));
        }
        if (local_1d8 != (undefined1  [8])&local_1c8) {
          operator_delete((void *)local_1d8,(ulong)((long)&local_1c8->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._0_8_ != &local_280) {
          operator_delete((void *)local_290._0_8_,(ulong)(local_280._M_allocated_capacity + 1));
        }
        iVar3 = (*context->_vptr_GeneratorContext[2])(context,local_150);
        pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar3);
        if (pZVar5 == (ZeroCopyOutputStream *)0x0) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_290,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                     ,0xd30);
          pLVar6 = internal::LogMessage::operator<<
                             ((LogMessage *)local_290,"CHECK failed: output.get(): ");
          internal::LogFinisher::operator=((LogFinisher *)local_1d8,pLVar6);
          internal::LogMessage::~LogMessage((LogMessage *)local_290);
        }
        io::Printer::Printer((Printer *)local_1d8,pZVar5,'$');
        local_208 = (undefined1  [8])0x0;
        ppFStack_200 = (FieldDescriptor **)0x0;
        local_1f8 = (_Base_ptr)0x0;
        if ((files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish !=
            (files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start) {
          uVar21 = 0;
          do {
            ppFVar8 = (files->
                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if (0 < *(int *)(ppFVar8[uVar21] + 0x88)) {
              ppFVar8 = ppFVar8 + uVar21;
              lVar15 = 0;
              lVar23 = 0;
              do {
                local_2c8._0_8_ = *(long *)(*ppFVar8 + 0x98) + lVar15;
                if ((_Base_ptr)ppFStack_200 == local_1f8) {
                  std::
                  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                              *)local_208,(iterator)ppFStack_200,(FieldDescriptor **)local_2c8);
                }
                else {
                  *ppFStack_200 = (FieldDescriptor *)local_2c8._0_8_;
                  ppFStack_200 = ppFStack_200 + 1;
                }
                lVar23 = lVar23 + 1;
                ppFVar8 = (files->
                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar21;
                lVar15 = lVar15 + 0xa8;
              } while (lVar23 < *(int *)(*ppFVar8 + 0x88));
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 < (ulong)((long)(files->
                                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(files->
                                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        io::Printer::Print((Printer *)local_1d8,
                           "/**\n * @fileoverview\n * @enhanceable\n * @public\n */\n// GENERATED CODE -- DO NOT EDIT!\n\n"
                          );
        local_2b8._8_8_ = local_2c8 + 8;
        stack0xfffffffffffffd40 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((ulong)uStack_2bc << 0x20);
        local_2b8._M_allocated_capacity = 0;
        local_2a0._M_allocated_capacity = 0;
        pGVar19 = this;
        local_2a8 = (_Base_ptr)local_2b8._8_8_;
        FindProvides(this,(GeneratorOptions *)(local_118 + 0x20),(Printer *)local_1d8,files,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2c8);
        FindProvidesForFields
                  (pGVar19,(GeneratorOptions *)(local_118 + 0x20),printer_00,
                   (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)local_208,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2c8);
        GenerateProvides(pGVar19,(GeneratorOptions *)(local_118 + 0x20),(Printer *)local_1d8,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2c8);
        if (local_f8[0x49] == '\x01') {
          io::Printer::Print((Printer *)local_1d8,"goog.setTestOnly();\n\n");
        }
        io::Printer::Print((Printer *)local_1d8,"\n");
        GenerateRequiresForLibrary
                  (this,(GeneratorOptions *)(local_118 + 0x20),(Printer *)local_1d8,files,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2c8);
        GenerateFilesInDepOrder
                  (this,(GeneratorOptions *)(local_118 + 0x20),(Printer *)local_1d8,files);
        if ((undefined1  [8])ppFStack_200 != local_208) {
          uVar21 = 0;
          do {
            if ((*(FieldDescriptor **)((long)local_208 + uVar21 * 8))[0x50] == (FieldDescriptor)0x1)
            {
              pGVar19 = (Generator *)
                        **(undefined8 **)
                          (*(long *)(*(FieldDescriptor **)((long)local_208 + uVar21 * 8) + 0x58) +
                          0x10);
              iVar3 = std::__cxx11::string::compare((char *)pGVar19);
              if (iVar3 != 0) {
                GenerateExtension(pGVar19,(GeneratorOptions *)(local_118 + 0x20),
                                  (Printer *)local_1d8,
                                  *(FieldDescriptor **)((long)local_208 + uVar21 * 8));
              }
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 < (ulong)((long)ppFStack_200 - (long)local_208 >> 3));
        }
        bVar2 = local_1a0[0x11];
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2c8);
        if (local_208 != (undefined1  [8])0x0) {
          operator_delete((void *)local_208,(long)local_1f8 - (long)local_208);
        }
        io::Printer::~Printer((Printer *)local_1d8);
        if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar5->_vptr_ZeroCopyOutputStream[1])();
        }
        if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
          operator_delete((void *)local_150._0_8_,(ulong)(local_150._16_8_ + 1));
        }
        if (bVar2 != false) goto LAB_0022a740;
      }
      else {
        if ((local_60 != '\0') || (local_f8._88_8_ != 0)) goto LAB_00229c4f;
        ppFStack_200 = (FieldDescriptor **)((ulong)ppFStack_200 & 0xffffffff00000000);
        local_1f8 = (_Base_ptr)0x0;
        local_1f0 = (_Base_ptr)&ppFStack_200;
        local_1e8 = (_Base_ptr)&ppFStack_200;
        local_1e0 = 0;
        local_2c8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_2b8._M_allocated_capacity = 0;
        stack0xfffffffffffffd40 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_1d0 = (undefined1  [8])((ulong)local_1d0 & 0xffffffff00000000);
        local_1c8 = (_Base_ptr)0x0;
        p_Stack_1c0 = (_Base_ptr)local_1d0;
        local_1b8 = (_Base_ptr)local_1d0;
        local_1b0._M_p = (pointer)0x0;
        p_Var13 = (_Base_ptr)(local_290 + 8);
        local_290._8_4_ = _S_red;
        local_280._M_allocated_capacity = 0;
        local_268._M_allocated_capacity = 0;
        ppFVar8 = (files->
                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_280._8_8_ = p_Var13;
        local_270 = p_Var13;
        if ((files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish != ppFVar8) {
          uVar21 = 0;
          do {
            anon_unknown_0::DepthFirstSearch
                      (ppFVar8[uVar21],
                       (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        *)local_2c8,
                       (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        *)local_1d8);
            std::
            _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
            ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                      ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                        *)local_290,
                       (files->
                       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar21);
            uVar21 = uVar21 + 1;
            ppFVar8 = (files->
                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          } while (uVar21 < (ulong)((long)(files->
                                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppFVar8 >> 3));
        }
        lVar15 = (long)stack0xfffffffffffffd40 - local_2c8._0_8_ >> 5;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._0_8_;
        if (0 < lVar15) {
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_2c8._0_8_ +
                       ((long)stack0xfffffffffffffd40 - local_2c8._0_8_ & 0xffffffffffffffe0));
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._0_8_;
          do {
            uVar21 = paVar12->_M_allocated_capacity;
            p_Var9 = p_Var13;
            for (uVar17 = local_280._M_allocated_capacity; (_Base_ptr)uVar17 != (_Base_ptr)0x0;
                uVar17 = (&((_Base_ptr)uVar17)->_M_left)[*(ulong *)(uVar17 + 0x20) < uVar21]) {
              if (*(ulong *)(uVar17 + 0x20) >= uVar21) {
                p_Var9 = (_Base_ptr)uVar17;
              }
            }
            p_Var18 = p_Var13;
            if ((p_Var9 != p_Var13) && (p_Var18 = p_Var9, uVar21 < *(ulong *)(p_Var9 + 1))) {
              p_Var18 = p_Var13;
            }
            if (p_Var18 == p_Var13) goto LAB_0022a75a;
            uVar21 = *(ulong *)(paVar12->_M_local_buf + 8);
            p_Var9 = p_Var13;
            for (uVar17 = local_280._M_allocated_capacity; (_Base_ptr)uVar17 != (_Base_ptr)0x0;
                uVar17 = (&((_Base_ptr)uVar17)->_M_left)[*(ulong *)(uVar17 + 0x20) < uVar21]) {
              if (*(ulong *)(uVar17 + 0x20) >= uVar21) {
                p_Var9 = (_Base_ptr)uVar17;
              }
            }
            p_Var18 = p_Var13;
            if ((p_Var9 != p_Var13) && (p_Var18 = p_Var9, uVar21 < *(ulong *)(p_Var9 + 1))) {
              p_Var18 = p_Var13;
            }
            if (p_Var18 == p_Var13) {
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar12->_M_local_buf + 8);
              goto LAB_0022a75a;
            }
            uVar21 = *(ulong *)(paVar12->_M_local_buf + 0x10);
            p_Var9 = p_Var13;
            for (uVar17 = local_280._M_allocated_capacity; (_Base_ptr)uVar17 != (_Base_ptr)0x0;
                uVar17 = (&((_Base_ptr)uVar17)->_M_left)[*(ulong *)(uVar17 + 0x20) < uVar21]) {
              if (*(ulong *)(uVar17 + 0x20) >= uVar21) {
                p_Var9 = (_Base_ptr)uVar17;
              }
            }
            p_Var18 = p_Var13;
            if ((p_Var9 != p_Var13) && (p_Var18 = p_Var9, uVar21 < *(ulong *)(p_Var9 + 1))) {
              p_Var18 = p_Var13;
            }
            if (p_Var18 == p_Var13) {
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar12->_M_local_buf + 0x10);
              goto LAB_0022a75a;
            }
            uVar21 = *(ulong *)(paVar12->_M_local_buf + 0x18);
            p_Var9 = p_Var13;
            for (uVar17 = local_280._M_allocated_capacity; (_Base_ptr)uVar17 != (_Base_ptr)0x0;
                uVar17 = (&((_Base_ptr)uVar17)->_M_left)[*(ulong *)(uVar17 + 0x20) < uVar21]) {
              if (*(ulong *)(uVar17 + 0x20) >= uVar21) {
                p_Var9 = (_Base_ptr)uVar17;
              }
            }
            p_Var18 = p_Var13;
            if ((p_Var9 != p_Var13) && (p_Var18 = p_Var9, uVar21 < *(ulong *)(p_Var9 + 1))) {
              p_Var18 = p_Var13;
            }
            if (p_Var18 == p_Var13) {
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar12->_M_local_buf + 0x18);
              goto LAB_0022a75a;
            }
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar12->_M_local_buf + 0x20);
            bVar2 = 1 < lVar15;
            lVar15 = lVar15 + -1;
          } while (bVar2);
        }
        lVar15 = (long)stack0xfffffffffffffd40 - (long)paVar14 >> 3;
        if (lVar15 == 1) {
LAB_0022a279:
          uVar21 = paVar14->_M_allocated_capacity;
          p_Var9 = p_Var13;
          for (uVar17 = local_280._M_allocated_capacity; (_Base_ptr)uVar17 != (_Base_ptr)0x0;
              uVar17 = (&((_Base_ptr)uVar17)->_M_left)[*(ulong *)(uVar17 + 0x20) < uVar21]) {
            if (*(ulong *)(uVar17 + 0x20) >= uVar21) {
              p_Var9 = (_Base_ptr)uVar17;
            }
          }
          p_Var18 = p_Var13;
          if ((p_Var9 != p_Var13) && (p_Var18 = p_Var9, uVar21 < *(ulong *)(p_Var9 + 1))) {
            p_Var18 = p_Var13;
          }
          paVar12 = paVar14;
          if (p_Var18 != p_Var13) {
            paVar12 = stack0xfffffffffffffd40;
          }
        }
        else if (lVar15 == 2) {
LAB_0022a22d:
          uVar21 = paVar14->_M_allocated_capacity;
          p_Var9 = p_Var13;
          for (uVar17 = local_280._M_allocated_capacity; (_Base_ptr)uVar17 != (_Base_ptr)0x0;
              uVar17 = (&((_Base_ptr)uVar17)->_M_left)[*(ulong *)(uVar17 + 0x20) < uVar21]) {
            if (*(ulong *)(uVar17 + 0x20) >= uVar21) {
              p_Var9 = (_Base_ptr)uVar17;
            }
          }
          p_Var18 = p_Var13;
          if ((p_Var9 != p_Var13) && (p_Var18 = p_Var9, uVar21 < *(ulong *)(p_Var9 + 1))) {
            p_Var18 = p_Var13;
          }
          paVar12 = paVar14;
          if (p_Var18 != p_Var13) {
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar14->_M_local_buf + 8);
            goto LAB_0022a279;
          }
        }
        else {
          paVar12 = stack0xfffffffffffffd40;
          if (lVar15 == 3) {
            uVar21 = paVar14->_M_allocated_capacity;
            p_Var9 = p_Var13;
            for (uVar17 = local_280._M_allocated_capacity; (_Base_ptr)uVar17 != (_Base_ptr)0x0;
                uVar17 = (&((_Base_ptr)uVar17)->_M_left)[*(ulong *)(uVar17 + 0x20) < uVar21]) {
              if (*(ulong *)(uVar17 + 0x20) >= uVar21) {
                p_Var9 = (_Base_ptr)uVar17;
              }
            }
            p_Var18 = p_Var13;
            if ((p_Var9 != p_Var13) && (p_Var18 = p_Var9, uVar21 < *(ulong *)(p_Var9 + 1))) {
              p_Var18 = p_Var13;
            }
            paVar12 = paVar14;
            if (p_Var18 != p_Var13) {
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar14->_M_local_buf + 8);
              goto LAB_0022a22d;
            }
          }
        }
LAB_0022a75a:
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar12->_M_local_buf + 8);
        if (paVar14 != stack0xfffffffffffffd40 && paVar12 != stack0xfffffffffffffd40) {
          do {
            uVar21 = paVar14->_M_allocated_capacity;
            p_Var9 = p_Var13;
            for (uVar17 = local_280._M_allocated_capacity; (_Base_ptr)uVar17 != (_Base_ptr)0x0;
                uVar17 = (&((_Base_ptr)uVar17)->_M_left)[*(ulong *)(uVar17 + 0x20) < uVar21]) {
              if (*(ulong *)(uVar17 + 0x20) >= uVar21) {
                p_Var9 = (_Base_ptr)uVar17;
              }
            }
            p_Var18 = p_Var13;
            if ((p_Var9 != p_Var13) && (p_Var18 = p_Var9, uVar21 < *(ulong *)(p_Var9 + 1))) {
              p_Var18 = p_Var13;
            }
            if (p_Var18 != p_Var13) {
              paVar12->_M_allocated_capacity = uVar21;
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar12->_M_local_buf + 8);
            }
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar14->_M_local_buf + 8);
          } while (paVar14 != stack0xfffffffffffffd40);
        }
        if (paVar12 != stack0xfffffffffffffd40) {
          unique0x10002622 = paVar12;
        }
        std::
        _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *)local_290);
        std::
        _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *)local_1d8);
        local_1d8[0] = local_98._M_left._0_1_;
        local_1b8 = (_Base_ptr)&local_1c8;
        desc = (string *)0x0;
        local_1c8 = (_Base_ptr)((ulong)local_1c8 & 0xffffffff00000000);
        p_Stack_1c0 = (_Base_ptr)0x0;
        local_1a8 = 0;
        local_188 = (_Base_ptr)(local_1a0 + 8);
        local_1a0._8_4_ = 0;
        local_1a0._16_8_ = (_Base_ptr)0x0;
        local_178 = (_Base_ptr)0x0;
        uVar21 = (ulong)(stack0xfffffffffffffd40 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2c8._0_8_);
        local_1b0._M_p = (pointer)local_1b8;
        local_180 = local_188;
        if (stack0xfffffffffffffd40 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._0_8_) {
          uVar24 = 0;
          uVar21 = 0;
          do {
            lVar15 = *(long *)(local_2c8._0_8_ + uVar24 * 8);
            local_58 = uVar21;
            if (0 < *(int *)(lVar15 + 0x58)) {
              lVar23 = 0;
              uVar21 = 0;
              do {
                pGVar16 = (GeneratorOptions *)(*(long *)(lVar15 + 0x60) + uVar21);
                (anonymous_namespace)::GetMessageFileName_abi_cxx11_
                          ((string *)local_290,(_anonymous_namespace_ *)(local_118 + 0x20),pGVar16,
                           (Descriptor *)desc);
                bVar2 = anon_unknown_0::FileDeduplicator::AddFile
                                  ((FileDeduplicator *)local_1d8,(string *)local_290,pGVar16,error);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290._0_8_ != &local_280) {
                  operator_delete((void *)local_290._0_8_,
                                  (ulong)(local_280._M_allocated_capacity + 1));
                }
                if (!bVar2) goto LAB_0022aa5b;
                lVar23 = lVar23 + 1;
                lVar15 = *(long *)(local_2c8._0_8_ + uVar24 * 8);
                desc = (string *)(long)*(int *)(lVar15 + 0x58);
                uVar21 = uVar21 + 0xa8;
              } while (lVar23 < (long)desc);
            }
            lVar15 = *(long *)(local_2c8._0_8_ + uVar24 * 8);
            if (0 < *(int *)(lVar15 + 0x68)) {
              uVar21 = 0;
              lVar23 = 0;
              do {
                pGVar16 = (GeneratorOptions *)(*(long *)(lVar15 + 0x70) + uVar21);
                (anonymous_namespace)::GetEnumFileName_abi_cxx11_
                          ((string *)local_290,(_anonymous_namespace_ *)(local_118 + 0x20),pGVar16,
                           (EnumDescriptor *)desc);
                bVar2 = anon_unknown_0::FileDeduplicator::AddFile
                                  ((FileDeduplicator *)local_1d8,(string *)local_290,pGVar16,error);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290._0_8_ != &local_280) {
                  operator_delete((void *)local_290._0_8_,
                                  (ulong)(local_280._M_allocated_capacity + 1));
                }
                if (!bVar2) goto LAB_0022aa5b;
                lVar23 = lVar23 + 1;
                lVar15 = *(long *)(local_2c8._0_8_ + uVar24 * 8);
                desc = (string *)(long)*(int *)(lVar15 + 0x68);
                uVar21 = uVar21 + 0x38;
              } while (lVar23 < (long)desc);
            }
            desc = *(string **)(local_2c8._0_8_ + uVar24 * 8);
            if ((int)desc[4]._M_string_length < 1) {
              bVar2 = false;
            }
            else {
              lVar15 = 0x58;
              uVar21 = 0;
              bVar2 = false;
              do {
                lVar23 = *(long *)((long)&desc[4].field_2 + 8);
                if ((*(char *)(lVar23 + -8 + lVar15) == '\x01') &&
                   (iVar3 = std::__cxx11::string::compare
                                      ((char *)**(undefined8 **)(*(long *)(lVar23 + lVar15) + 0x10))
                   , iVar3 != 0)) {
                  bVar2 = true;
                }
                uVar21 = uVar21 + 1;
                desc = *(string **)(local_2c8._0_8_ + uVar24 * 8);
                lVar15 = lVar15 + 0xa8;
              } while ((long)uVar21 < (long)(int)desc[4]._M_string_length);
            }
            if (bVar2) {
              (anonymous_namespace)::GetExtensionFileName_abi_cxx11_
                        ((string *)local_290,(_anonymous_namespace_ *)(local_118 + 0x20),
                         *(GeneratorOptions **)(local_2c8._0_8_ + uVar24 * 8),(FileDescriptor *)desc
                        );
              desc = error;
              bVar2 = anon_unknown_0::FileDeduplicator::AddFile
                                ((FileDeduplicator *)local_1d8,(string *)local_290,
                                 *(void **)(local_2c8._0_8_ + uVar24 * 8),error);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290._0_8_ != &local_280) {
                operator_delete((void *)local_290._0_8_,(ulong)(local_280._M_allocated_capacity + 1)
                               );
              }
              if (!bVar2) {
LAB_0022aa5b:
                uVar21 = local_58;
                if ((local_58 & 1) == 0) goto LAB_0022aa7e;
                break;
              }
            }
            uVar24 = uVar24 + 1;
            uVar7 = (long)stack0xfffffffffffffd40 - local_2c8._0_8_ >> 3;
            uVar21 = CONCAT71((int7)(uVar21 >> 8),uVar7 <= uVar24);
          } while (uVar24 < uVar7);
        }
        std::
        _Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
        ::operator=((_Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
                     *)local_208,
                    (_Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
                     *)local_1a0);
LAB_0022aa7e:
        std::
        _Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
        ::~_Rb_tree((_Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
                     *)local_1a0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_void_*>_>_>
                     *)local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_2c8._0_8_,local_2b8._M_allocated_capacity - local_2c8._0_8_)
          ;
        }
        if ((uVar21 & 1) == 0) {
LAB_0022b3c8:
          std::
          _Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
          ::~_Rb_tree((_Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
                       *)local_208);
          goto LAB_0022a740;
        }
        ppFVar8 = (files->
                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish != ppFVar8) {
          uVar21 = 0;
          do {
            pGVar16 = (GeneratorOptions *)ppFVar8[uVar21];
            if (0 < (int)(pGVar16->library)._M_string_length) {
              lVar15 = 0;
              do {
                pGVar25 = (GeneratorOptions *)
                          (lVar15 * 0xa8 + (pGVar16->library).field_2._M_allocated_capacity);
                p_Var9 = (_Base_ptr)&ppFStack_200;
                for (p_Var13 = local_1f8; p_Var13 != (_Base_ptr)0x0;
                    p_Var13 = (&p_Var13->_M_left)[*(GeneratorOptions **)(p_Var13 + 1) < pGVar25]) {
                  if (*(GeneratorOptions **)(p_Var13 + 1) >= pGVar25) {
                    p_Var9 = p_Var13;
                  }
                }
                p_Var13 = (_Base_ptr)&ppFStack_200;
                if ((p_Var9 != (_Base_ptr)&ppFStack_200) &&
                   (p_Var13 = p_Var9, pGVar25 < *(GeneratorOptions **)(p_Var9 + 1))) {
                  p_Var13 = (_Base_ptr)&ppFStack_200;
                }
                if (p_Var13 == (_Base_ptr)&ppFStack_200) {
                  uVar24 = 0x10;
                }
                else {
                  (anonymous_namespace)::GetMessageFileName_abi_cxx11_
                            (&local_228,(_anonymous_namespace_ *)(local_118 + 0x20),pGVar25,
                             (Descriptor *)p_Var13);
                  iVar3 = (*context->_vptr_GeneratorContext[2])(context,&local_228);
                  pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar3);
                  if (pZVar5 == (ZeroCopyOutputStream *)0x0) {
                    internal::LogMessage::LogMessage
                              ((LogMessage *)local_290,LOGLEVEL_DFATAL,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                               ,0xd62);
                    pLVar6 = internal::LogMessage::operator<<
                                       ((LogMessage *)local_290,"CHECK failed: output.get(): ");
                    internal::LogFinisher::operator=((LogFinisher *)local_1d8,pLVar6);
                    internal::LogMessage::~LogMessage((LogMessage *)local_290);
                  }
                  io::Printer::Printer((Printer *)local_1d8,pZVar5,'$');
                  io::Printer::Print((Printer *)local_1d8,
                                     "/**\n * @fileoverview\n * @enhanceable\n * @public\n */\n// GENERATED CODE -- DO NOT EDIT!\n\n"
                                    );
                  local_258._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                  local_258._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  local_258._M_impl.super__Rb_tree_header._M_header._M_left =
                       &local_258._M_impl.super__Rb_tree_header._M_header;
                  local_258._M_impl.super__Rb_tree_header._M_node_count = 0;
                  pGVar19 = this;
                  local_258._M_impl.super__Rb_tree_header._M_header._M_right =
                       local_258._M_impl.super__Rb_tree_header._M_header._M_left;
                  FindProvidesForMessage
                            (this,(GeneratorOptions *)(local_118 + 0x20),(Printer *)local_1d8,
                             (Descriptor *)pGVar25,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_258);
                  GenerateProvides(pGVar19,(GeneratorOptions *)(local_118 + 0x20),
                                   (Printer *)local_1d8,
                                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&local_258);
                  if (local_f8[0x49] == '\x01') {
                    io::Printer::Print((Printer *)local_1d8,"goog.setTestOnly();\n\n");
                  }
                  io::Printer::Print((Printer *)local_1d8,"\n");
                  GenerateRequiresForMessage
                            (this,(GeneratorOptions *)(local_118 + 0x20),(Printer *)local_1d8,
                             (Descriptor *)pGVar25,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_258);
                  GenerateClass(this,(GeneratorOptions *)(local_118 + 0x20),(Printer *)local_1d8,
                                (Descriptor *)pGVar25);
                  uVar24 = (ulong)local_1a0._16_8_ >> 8 & 0xff;
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~_Rb_tree(&local_258);
                  io::Printer::~Printer((Printer *)local_1d8);
                  if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
                    (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_228._M_dataplus._M_p != &local_228.field_2) {
                    operator_delete(local_228._M_dataplus._M_p,
                                    local_228.field_2._M_allocated_capacity + 1);
                  }
                }
                uVar22 = (uint)uVar24;
                if ((uVar24 & 0xf) != 0) goto LAB_0022ad2b;
                lVar15 = lVar15 + 1;
              } while (lVar15 < (int)(pGVar16->library)._M_string_length);
            }
            uVar22 = 0xe;
LAB_0022ad2b:
            if (uVar22 == 0xe) {
              if (0 < *(int *)((long)&(pGVar16->library).field_2 + 8)) {
                lVar15 = 0;
                do {
                  pGVar25 = (GeneratorOptions *)
                            (lVar15 * 0x38 + *(long *)&pGVar16->error_on_name_conflict);
                  p_Var9 = (_Base_ptr)&ppFStack_200;
                  for (p_Var13 = local_1f8; p_Var13 != (_Base_ptr)0x0;
                      p_Var13 = (&p_Var13->_M_left)[*(GeneratorOptions **)(p_Var13 + 1) < pGVar25])
                  {
                    if (*(GeneratorOptions **)(p_Var13 + 1) >= pGVar25) {
                      p_Var9 = p_Var13;
                    }
                  }
                  p_Var13 = (_Base_ptr)&ppFStack_200;
                  if ((p_Var9 != (_Base_ptr)&ppFStack_200) &&
                     (p_Var13 = p_Var9, pGVar25 < *(GeneratorOptions **)(p_Var9 + 1))) {
                    p_Var13 = (_Base_ptr)&ppFStack_200;
                  }
                  if (p_Var13 == (_Base_ptr)&ppFStack_200) {
                    uVar22 = 0x13;
                  }
                  else {
                    (anonymous_namespace)::GetEnumFileName_abi_cxx11_
                              (&local_228,(_anonymous_namespace_ *)(local_118 + 0x20),pGVar25,
                               (EnumDescriptor *)p_Var13);
                    iVar3 = (*context->_vptr_GeneratorContext[2])(context,&local_228);
                    pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar3);
                    if (pZVar5 == (ZeroCopyOutputStream *)0x0) {
                      internal::LogMessage::LogMessage
                                ((LogMessage *)local_2c8,LOGLEVEL_DFATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                                 ,0xd7c);
                      pLVar6 = internal::LogMessage::operator<<
                                         ((LogMessage *)local_2c8,"CHECK failed: output.get(): ");
                      internal::LogFinisher::operator=((LogFinisher *)local_1d8,pLVar6);
                      internal::LogMessage::~LogMessage((LogMessage *)local_2c8);
                    }
                    pPVar20 = (Printer *)local_1d8;
                    io::Printer::Printer(pPVar20,pZVar5,'$');
                    io::Printer::Print(pPVar20,
                                       "/**\n * @fileoverview\n * @enhanceable\n * @public\n */\n// GENERATED CODE -- DO NOT EDIT!\n\n"
                                      );
                    local_258._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                    local_258._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                    local_258._M_impl.super__Rb_tree_header._M_header._M_left =
                         &local_258._M_impl.super__Rb_tree_header._M_header;
                    local_258._M_impl.super__Rb_tree_header._M_node_count = 0;
                    local_258._M_impl.super__Rb_tree_header._M_header._M_right =
                         local_258._M_impl.super__Rb_tree_header._M_header._M_left;
                    FindProvidesForEnum((Generator *)pPVar20,(GeneratorOptions *)(local_118 + 0x20),
                                        printer_01,(EnumDescriptor *)pGVar25,
                                        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&local_258);
                    GenerateProvides((Generator *)pPVar20,(GeneratorOptions *)(local_118 + 0x20),
                                     (Printer *)local_1d8,
                                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_258);
                    if (local_f8[0x49] == '\x01') {
                      io::Printer::Print((Printer *)local_1d8,"goog.setTestOnly();\n\n");
                    }
                    pPVar20 = (Printer *)local_1d8;
                    io::Printer::Print((Printer *)local_1d8,"\n");
                    GenerateEnum((Generator *)pPVar20,(GeneratorOptions *)(local_118 + 0x20),
                                 (Printer *)local_1d8,(EnumDescriptor *)pGVar25);
                    uVar22 = (uint)local_1a0[0x11];
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~_Rb_tree(&local_258);
                    io::Printer::~Printer((Printer *)local_1d8);
                    if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
                      (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_228._M_dataplus._M_p != &local_228.field_2) {
                      operator_delete(local_228._M_dataplus._M_p,
                                      local_228.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if ((uVar22 != 0x13) && (uVar22 != 0)) goto LAB_0022af60;
                  lVar15 = lVar15 + 1;
                } while (lVar15 < *(int *)((long)&(pGVar16->library).field_2 + 8));
              }
              uVar22 = 0x11;
LAB_0022af60:
              if (uVar22 == 0x11) {
                p_Var9 = (_Base_ptr)&ppFStack_200;
                for (p_Var13 = local_1f8; p_Var13 != (_Base_ptr)0x0;
                    p_Var13 = (&p_Var13->_M_left)[*(GeneratorOptions **)(p_Var13 + 1) < pGVar16]) {
                  if (*(GeneratorOptions **)(p_Var13 + 1) >= pGVar16) {
                    p_Var9 = p_Var13;
                  }
                }
                p_Var13 = (_Base_ptr)&ppFStack_200;
                if ((p_Var9 != (_Base_ptr)&ppFStack_200) &&
                   (p_Var13 = p_Var9, pGVar16 < *(GeneratorOptions **)(p_Var9 + 1))) {
                  p_Var13 = (_Base_ptr)&ppFStack_200;
                }
                uVar22 = 0;
                if (p_Var13 != (_Base_ptr)&ppFStack_200) {
                  (anonymous_namespace)::GetExtensionFileName_abi_cxx11_
                            (&local_228,(_anonymous_namespace_ *)(local_118 + 0x20),pGVar16,
                             (FileDescriptor *)p_Var13);
                  iVar3 = (*context->_vptr_GeneratorContext[2])(context,&local_228);
                  pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_03,iVar3);
                  pPVar20 = (Printer *)local_1d8;
                  if (pZVar5 == (ZeroCopyOutputStream *)0x0) {
                    internal::LogMessage::LogMessage
                              ((LogMessage *)local_150,LOGLEVEL_DFATAL,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                               ,0xd93);
                    pLVar6 = internal::LogMessage::operator<<
                                       ((LogMessage *)local_150,"CHECK failed: output.get(): ");
                    internal::LogFinisher::operator=((LogFinisher *)pPVar20,pLVar6);
                    internal::LogMessage::~LogMessage((LogMessage *)local_150);
                  }
                  io::Printer::Printer(pPVar20,pZVar5,'$');
                  io::Printer::Print(pPVar20,
                                     "/**\n * @fileoverview\n * @enhanceable\n * @public\n */\n// GENERATED CODE -- DO NOT EDIT!\n\n"
                                    );
                  local_258._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                  local_258._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  local_258._M_impl.super__Rb_tree_header._M_header._M_left =
                       &local_258._M_impl.super__Rb_tree_header._M_header;
                  local_258._M_impl.super__Rb_tree_header._M_node_count = 0;
                  local_118._16_8_ = (pointer)0x0;
                  local_118._0_8_ = (pointer)0x0;
                  local_118._8_8_ = (ZeroCopyOutputStream *)0x0;
                  pFVar10 = (files->
                            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar21];
                  printer_02 = extraout_RDX;
                  local_258._M_impl.super__Rb_tree_header._M_header._M_right =
                       local_258._M_impl.super__Rb_tree_header._M_header._M_left;
                  if (0 < *(int *)(pFVar10 + 0x88)) {
                    lVar23 = 0;
                    lVar15 = 0;
                    do {
                      if (*(char *)(*(long *)(pFVar10 + 0x98) + 0x50 + lVar23) == '\x01') {
                        pPVar20 = (Printer *)
                                  **(undefined8 **)
                                    (*(long *)(*(long *)(pFVar10 + 0x98) + 0x58 + lVar23) + 0x10);
                        iVar3 = std::__cxx11::string::compare((char *)pPVar20);
                        printer_02 = extraout_RDX_00;
                        if (iVar3 != 0) {
                          local_50 = (FieldDescriptor *)
                                     (*(long *)((files->
                                                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                                )._M_impl.super__Vector_impl_data._M_start[uVar21] +
                                               0x98) + lVar23);
                          pPVar20 = (Printer *)local_118;
                          std::
                          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                          ::emplace_back<google::protobuf::FieldDescriptor_const*>
                                    ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                                      *)pPVar20,&local_50);
                          printer_02 = extraout_RDX_01;
                        }
                      }
                      lVar15 = lVar15 + 1;
                      pFVar10 = (files->
                                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar21];
                      lVar23 = lVar23 + 0xa8;
                    } while (lVar15 < *(int *)(pFVar10 + 0x88));
                  }
                  FindProvidesForFields
                            ((Generator *)pPVar20,(GeneratorOptions *)(local_118 + 0x20),printer_02,
                             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              *)local_118,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_258);
                  GenerateProvides((Generator *)pPVar20,(GeneratorOptions *)(local_118 + 0x20),
                                   (Printer *)local_1d8,
                                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&local_258);
                  if (local_f8[0x49] == '\x01') {
                    io::Printer::Print((Printer *)local_1d8,"goog.setTestOnly();\n\n");
                  }
                  io::Printer::Print((Printer *)local_1d8,"\n");
                  GenerateRequiresForExtensions
                            (this,(GeneratorOptions *)(local_118 + 0x20),(Printer *)local_1d8,
                             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              *)local_118,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_258);
                  pFVar10 = (files->
                            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar21];
                  if (0 < *(int *)(pFVar10 + 0x88)) {
                    lVar23 = 0;
                    lVar15 = 0;
                    do {
                      if (*(char *)(*(long *)(pFVar10 + 0x98) + 0x50 + lVar23) == '\x01') {
                        pGVar19 = (Generator *)
                                  **(undefined8 **)
                                    (*(long *)(*(long *)(pFVar10 + 0x98) + 0x58 + lVar23) + 0x10);
                        iVar3 = std::__cxx11::string::compare((char *)pGVar19);
                        if (iVar3 != 0) {
                          GenerateExtension(pGVar19,(GeneratorOptions *)(local_118 + 0x20),
                                            (Printer *)local_1d8,
                                            (FieldDescriptor *)
                                            (*(long *)((files->
                                                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar21]
                                                  + 0x98) + lVar23));
                        }
                      }
                      lVar15 = lVar15 + 1;
                      pFVar10 = (files->
                                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar21];
                      lVar23 = lVar23 + 0xa8;
                    } while (lVar15 < *(int *)(pFVar10 + 0x88));
                  }
                  if ((pointer)local_118._0_8_ != (pointer)0x0) {
                    operator_delete((void *)local_118._0_8_,local_118._16_8_ - local_118._0_8_);
                  }
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~_Rb_tree(&local_258);
                  io::Printer::~Printer((Printer *)local_1d8);
                  if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
                    (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_228._M_dataplus._M_p != &local_228.field_2) {
                    operator_delete(local_228._M_dataplus._M_p,
                                    local_228.field_2._M_allocated_capacity + 1);
                  }
                }
              }
            }
            if (uVar22 != 0) goto LAB_0022b3c8;
            uVar21 = uVar21 + 1;
            ppFVar8 = (files->
                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          } while (uVar21 < (ulong)((long)(files->
                                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppFVar8 >> 3));
        }
        std::
        _Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
        ::~_Rb_tree((_Rb_tree<const_void_*,_const_void_*,_std::_Identity<const_void_*>,_std::less<const_void_*>,_std::allocator<const_void_*>_>
                     *)local_208);
      }
    }
    else {
LAB_00229c4f:
      ppFVar8 = (files->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((files->
          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_finish != ppFVar8) {
        uVar21 = 0;
        do {
          pFVar10 = ppFVar8[uVar21];
          local_1d8 = (undefined1  [8])&local_1c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1d8,local_f8._0_8_,(pointer)(local_f8._8_8_ + local_f8._0_8_));
          std::__cxx11::string::append((char *)local_1d8);
          anon_unknown_0::GetJSFilename
                    ((string *)local_150,(GeneratorOptions *)(local_118 + 0x20),*(string **)pFVar10)
          ;
          p_Var13 = (_Base_ptr)0xf;
          if (local_1d8 != (undefined1  [8])&local_1c8) {
            p_Var13 = local_1c8;
          }
          if (p_Var13 < (_Base_ptr)(local_150._8_8_ + (long)local_1d0)) {
            p_Var13 = (_Base_ptr)0xf;
            if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
              p_Var13 = (_Base_ptr)local_150._16_8_;
            }
            if (p_Var13 < (_Base_ptr)(local_150._8_8_ + (long)local_1d0)) goto LAB_00229d26;
            puVar4 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)local_150,0,(char *)0x0,(ulong)local_1d8);
          }
          else {
LAB_00229d26:
            puVar4 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)local_1d8,local_150._0_8_);
          }
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar4 == paVar14) {
            local_2b8._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_2b8._8_8_ = puVar4[3];
            local_2c8._0_8_ = &local_2b8;
          }
          else {
            local_2b8._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_2c8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar4;
          }
          unique0x00012000 =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)puVar4[1];
          *puVar4 = paVar14;
          puVar4[1] = 0;
          paVar14->_M_local_buf[0] = '\0';
          if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
            operator_delete((void *)local_150._0_8_,(ulong)(local_150._16_8_ + 1));
          }
          if (local_1d8 != (undefined1  [8])&local_1c8) {
            operator_delete((void *)local_1d8,(ulong)((long)&local_1c8->_M_color + 1));
          }
          iVar3 = (*context->_vptr_GeneratorContext[2])(context,local_2c8);
          pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar3);
          if (pZVar5 == (ZeroCopyOutputStream *)0x0) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_290,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                       ,0xdb6);
            pLVar6 = internal::LogMessage::operator<<
                               ((LogMessage *)local_290,"CHECK failed: output.get(): ");
            internal::LogFinisher::operator=((LogFinisher *)local_1d8,pLVar6);
            internal::LogMessage::~LogMessage((LogMessage *)local_290);
          }
          io::Printer::Printer((Printer *)local_1d8,pZVar5,'$');
          GenerateFile(this,(GeneratorOptions *)(local_118 + 0x20),(Printer *)local_1d8,pFVar10);
          bVar2 = local_1a0[0x11];
          io::Printer::~Printer((Printer *)local_1d8);
          if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._0_8_ != &local_2b8) {
            operator_delete((void *)local_2c8._0_8_,(ulong)(local_2b8._M_allocated_capacity + 1));
          }
          if (bVar2 != false) goto LAB_0022a740;
          uVar21 = uVar21 + 1;
          ppFVar8 = (files->
                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar21 < (ulong)((long)(files->
                                        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar8
                                 >> 3));
      }
    }
    bVar2 = true;
  }
  else {
LAB_0022a740:
    bVar2 = false;
  }
  if (local_98._M_right != (_Base_ptr)(local_f8 + 0x88)) {
    operator_delete(local_98._M_right,local_70[0] + 1);
  }
  if ((_Base_ptr)local_f8._80_8_ != (_Base_ptr)(local_f8 + 0x60)) {
    operator_delete((void *)local_f8._80_8_,(ulong)((long)(_func_int ***)local_98._0_8_ + 1));
  }
  if ((undefined1 *)local_f8._32_8_ != local_f8 + 0x30) {
    operator_delete((void *)local_f8._32_8_,local_f8._48_8_ + 1);
  }
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48);
  return bVar2;
}

Assistant:

bool Generator::GenerateAll(const std::vector<const FileDescriptor*>& files,
                            const string& parameter,
                            GeneratorContext* context,
                            string* error) const {
  std::vector< std::pair< string, string > > option_pairs;
  ParseGeneratorParameter(parameter, &option_pairs);
  GeneratorOptions options;
  if (!options.ParseFromOptions(option_pairs, error)) {
    return false;
  }


  if (options.output_mode() == GeneratorOptions::kEverythingInOneFile) {
    // All output should go in a single file.
    string filename = options.output_dir + "/" + options.library +
                      options.GetFileNameExtension();
    google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
    GOOGLE_CHECK(output.get());
    io::Printer printer(output.get(), '$');

    // Pull out all extensions -- we need these to generate all
    // provides/requires.
    std::vector<const FieldDescriptor*> extensions;
    for (int i = 0; i < files.size(); i++) {
      for (int j = 0; j < files[i]->extension_count(); j++) {
        const FieldDescriptor* extension = files[i]->extension(j);
        extensions.push_back(extension);
      }
    }

    GenerateHeader(options, &printer);

    std::set<string> provided;
    FindProvides(options, &printer, files, &provided);
    FindProvidesForFields(options, &printer, extensions, &provided);
    GenerateProvides(options, &printer, &provided);
    GenerateTestOnly(options, &printer);
    GenerateRequiresForLibrary(options, &printer, files, &provided);

    GenerateFilesInDepOrder(options, &printer, files);

    for (int i = 0; i < extensions.size(); i++) {
      if (ShouldGenerateExtension(extensions[i])) {
        GenerateExtension(options, &printer, extensions[i]);
      }
    }

    if (printer.failed()) {
      return false;
    }
  } else if (options.output_mode() == GeneratorOptions::kOneOutputFilePerType) {
    std::set<const void*> allowed_set;
    if (!GenerateJspbAllowedSet(options, files, &allowed_set, error)) {
      return false;
    }

    for (int i = 0; i < files.size(); i++) {
      const FileDescriptor* file = files[i];
      for (int j = 0; j < file->message_type_count(); j++) {
        const Descriptor* desc = file->message_type(j);
        if (allowed_set.count(desc) == 0) {
          continue;
        }

        string filename = GetMessageFileName(options, desc);
        google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
            context->Open(filename));
        GOOGLE_CHECK(output.get());
        io::Printer printer(output.get(), '$');

        GenerateHeader(options, &printer);

        std::set<string> provided;
        FindProvidesForMessage(options, &printer, desc, &provided);
        GenerateProvides(options, &printer, &provided);
        GenerateTestOnly(options, &printer);
        GenerateRequiresForMessage(options, &printer, desc, &provided);

        GenerateClass(options, &printer, desc);

        if (printer.failed()) {
          return false;
        }
      }
      for (int j = 0; j < file->enum_type_count(); j++) {
        const EnumDescriptor* enumdesc = file->enum_type(j);
        if (allowed_set.count(enumdesc) == 0) {
          continue;
        }

        string filename = GetEnumFileName(options, enumdesc);
        google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
            context->Open(filename));
        GOOGLE_CHECK(output.get());
        io::Printer printer(output.get(), '$');

        GenerateHeader(options, &printer);

        std::set<string> provided;
        FindProvidesForEnum(options, &printer, enumdesc, &provided);
        GenerateProvides(options, &printer, &provided);
        GenerateTestOnly(options, &printer);

        GenerateEnum(options, &printer, enumdesc);

        if (printer.failed()) {
          return false;
        }
      }
      // File-level extensions (message-level extensions are generated under
      // the enclosing message).
      if (allowed_set.count(file) == 1) {
        string filename = GetExtensionFileName(options, file);

        google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
            context->Open(filename));
        GOOGLE_CHECK(output.get());
        io::Printer printer(output.get(), '$');

        GenerateHeader(options, &printer);

        std::set<string> provided;
        std::vector<const FieldDescriptor*> fields;

        for (int j = 0; j < files[i]->extension_count(); j++) {
          if (ShouldGenerateExtension(files[i]->extension(j))) {
            fields.push_back(files[i]->extension(j));
          }
        }

        FindProvidesForFields(options, &printer, fields, &provided);
        GenerateProvides(options, &printer, &provided);
        GenerateTestOnly(options, &printer);
        GenerateRequiresForExtensions(options, &printer, fields, &provided);

        for (int j = 0; j < files[i]->extension_count(); j++) {
          if (ShouldGenerateExtension(files[i]->extension(j))) {
            GenerateExtension(options, &printer, files[i]->extension(j));
          }
        }
      }
    }
  } else /* options.output_mode() == kOneOutputFilePerInputFile */ {
    // Generate one output file per input (.proto) file.

    for (int i = 0; i < files.size(); i++) {
      const google::protobuf::FileDescriptor* file = files[i];

      string filename =
          options.output_dir + "/" + GetJSFilename(options, file->name());
      google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
      GOOGLE_CHECK(output.get());
      io::Printer printer(output.get(), '$');

      GenerateFile(options, &printer, file);

      if (printer.failed()) {
        return false;
      }
    }
  }

  return true;
}